

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cesl_llfifo_playground.c
# Opt level: O2

int main1(void)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  
  cesl_dprintf("Lockless FIFO playground\n");
  uVar1 = cesl_llfifo_create(&my_fifo_g,0x400,4,my_fifo_buffer_g);
  cesl_dprintf("llfifo_create()         : \'%d\'\n",(ulong)uVar1);
  uVar1 = cesl_llfifo_empty(&my_fifo_g);
  uVar2 = cesl_llfifo_full(&my_fifo_g);
  cesl_dprintf("llfifo_empty()          : \'%d\'  llfifo_full(): \'%d\'\n",(ulong)uVar1,(ulong)uVar2
              );
  uVar1 = test_llfifo_push("first");
  cesl_dprintf("llfifo_push(\'first\')    : \'%d\'\n",(ulong)uVar1);
  uVar1 = cesl_llfifo_empty(&my_fifo_g);
  uVar2 = cesl_llfifo_full(&my_fifo_g);
  cesl_dprintf("llfifo_empty()          : \'%d\'  llfifo_full(): \'%d\'\n",(ulong)uVar1,(ulong)uVar2
              );
  uVar1 = test_llfifo_push("second");
  cesl_dprintf("llfifo_push(\'second\')   : \'%d\'\n",(ulong)uVar1);
  uVar1 = cesl_llfifo_empty(&my_fifo_g);
  uVar2 = cesl_llfifo_full(&my_fifo_g);
  cesl_dprintf("llfifo_empty()          : \'%d\'  llfifo_full(): \'%d\'\n",(ulong)uVar1,(ulong)uVar2
              );
  uVar1 = test_llfifo_push("third");
  cesl_dprintf("llfifo_push(\'third\')    : \'%d\'\n",(ulong)uVar1);
  uVar1 = cesl_llfifo_empty(&my_fifo_g);
  uVar2 = cesl_llfifo_full(&my_fifo_g);
  cesl_dprintf("llfifo_empty()          : \'%d\'  llfifo_full(): \'%d\'\n",(ulong)uVar1,(ulong)uVar2
              );
  uVar1 = test_llfifo_push("fourth");
  cesl_dprintf("llfifo_push(\'fourth\')   : \'%d\'\n",(ulong)uVar1);
  uVar1 = cesl_llfifo_empty(&my_fifo_g);
  uVar2 = cesl_llfifo_full(&my_fifo_g);
  cesl_dprintf("llfifo_empty()          : \'%d\'  llfifo_full(): \'%d\'\n",(ulong)uVar1,(ulong)uVar2
              );
  pcVar3 = cesl_llfifo_front(&my_fifo_g);
  cesl_dprintf("llfifo_front()          : \'%s\'\n",pcVar3);
  cesl_llfifo_pop(&my_fifo_g);
  uVar1 = cesl_llfifo_empty(&my_fifo_g);
  uVar2 = cesl_llfifo_full(&my_fifo_g);
  cesl_dprintf("llfifo_empty()          : \'%d\'  llfifo_full(): \'%d\'\n",(ulong)uVar1,(ulong)uVar2
              );
  pcVar3 = cesl_llfifo_front(&my_fifo_g);
  cesl_dprintf("llfifo_front()          : \'%s\'\n",pcVar3);
  uVar1 = test_llfifo_push("fourth");
  cesl_dprintf("llfifo_push(\'fourth\')   : \'%d\'\n",(ulong)uVar1);
  uVar1 = cesl_llfifo_empty(&my_fifo_g);
  uVar2 = cesl_llfifo_full(&my_fifo_g);
  cesl_dprintf("llfifo_empty()          : \'%d\'  llfifo_full(): \'%d\'\n",(ulong)uVar1,(ulong)uVar2
              );
  cesl_llfifo_pop(&my_fifo_g);
  uVar1 = cesl_llfifo_empty(&my_fifo_g);
  uVar2 = cesl_llfifo_full(&my_fifo_g);
  cesl_dprintf("llfifo_empty()          : \'%d\'  llfifo_full(): \'%d\'\n",(ulong)uVar1,(ulong)uVar2
              );
  pcVar3 = cesl_llfifo_front(&my_fifo_g);
  cesl_dprintf("llfifo_front()          : \'%s\'\n",pcVar3);
  cesl_llfifo_pop(&my_fifo_g);
  uVar1 = cesl_llfifo_empty(&my_fifo_g);
  uVar2 = cesl_llfifo_full(&my_fifo_g);
  cesl_dprintf("llfifo_empty()          : \'%d\'  llfifo_full(): \'%d\'\n",(ulong)uVar1,(ulong)uVar2
              );
  pcVar3 = cesl_llfifo_front(&my_fifo_g);
  cesl_dprintf("llfifo_front()          : \'%s\'\n",pcVar3);
  cesl_llfifo_pop(&my_fifo_g);
  uVar1 = cesl_llfifo_empty(&my_fifo_g);
  uVar2 = cesl_llfifo_full(&my_fifo_g);
  cesl_dprintf("llfifo_empty()          : \'%d\'  llfifo_full(): \'%d\'\n",(ulong)uVar1,(ulong)uVar2
              );
  pcVar3 = cesl_llfifo_front(&my_fifo_g);
  cesl_dprintf("llfifo_front()          : \'%s\'\n",pcVar3);
  uVar1 = test_llfifo_push("fifth");
  cesl_dprintf("llfifo_push(\'fifth\')   : \'%d\'\n",(ulong)uVar1);
  uVar1 = cesl_llfifo_empty(&my_fifo_g);
  uVar2 = cesl_llfifo_full(&my_fifo_g);
  cesl_dprintf("llfifo_empty()          : \'%d\'  llfifo_full(): \'%d\'\n",(ulong)uVar1,(ulong)uVar2
              );
  pcVar3 = cesl_llfifo_front(&my_fifo_g);
  cesl_dprintf("llfifo_front()          : \'%s\'\n",pcVar3);
  return 0;
}

Assistant:

int main1()
{
    cesl_dprintf("Lockless FIFO playground\n");
    const int res = cesl_llfifo_create(&my_fifo_g, my_fifo_elem_max_size, my_fifo_elems_max_count, (char*)my_fifo_buffer_g);
    cesl_dprintf("llfifo_create()         : '%d'\n", res);
    cesl_dprintf("llfifo_empty()          : '%d'  llfifo_full(): '%d'\n", cesl_llfifo_empty(&my_fifo_g), cesl_llfifo_full(&my_fifo_g));

    cesl_dprintf("llfifo_push('first')    : '%d'\n", test_llfifo_push("first"));
    cesl_dprintf("llfifo_empty()          : '%d'  llfifo_full(): '%d'\n", cesl_llfifo_empty(&my_fifo_g), cesl_llfifo_full(&my_fifo_g));
    cesl_dprintf("llfifo_push('second')   : '%d'\n", test_llfifo_push("second"));
    cesl_dprintf("llfifo_empty()          : '%d'  llfifo_full(): '%d'\n", cesl_llfifo_empty(&my_fifo_g), cesl_llfifo_full(&my_fifo_g));
    cesl_dprintf("llfifo_push('third')    : '%d'\n", test_llfifo_push("third"));
    cesl_dprintf("llfifo_empty()          : '%d'  llfifo_full(): '%d'\n", cesl_llfifo_empty(&my_fifo_g), cesl_llfifo_full(&my_fifo_g));
    cesl_dprintf("llfifo_push('fourth')   : '%d'\n", test_llfifo_push("fourth"));
    cesl_dprintf("llfifo_empty()          : '%d'  llfifo_full(): '%d'\n", cesl_llfifo_empty(&my_fifo_g), cesl_llfifo_full(&my_fifo_g));

    cesl_dprintf("llfifo_front()          : '%s'\n", cesl_llfifo_front(&my_fifo_g));
    cesl_llfifo_pop(&my_fifo_g);
    cesl_dprintf("llfifo_empty()          : '%d'  llfifo_full(): '%d'\n", cesl_llfifo_empty(&my_fifo_g), cesl_llfifo_full(&my_fifo_g));
    cesl_dprintf("llfifo_front()          : '%s'\n", cesl_llfifo_front(&my_fifo_g));
    cesl_dprintf("llfifo_push('fourth')   : '%d'\n", test_llfifo_push("fourth"));
    cesl_dprintf("llfifo_empty()          : '%d'  llfifo_full(): '%d'\n", cesl_llfifo_empty(&my_fifo_g), cesl_llfifo_full(&my_fifo_g));

    cesl_llfifo_pop(&my_fifo_g);
    cesl_dprintf("llfifo_empty()          : '%d'  llfifo_full(): '%d'\n", cesl_llfifo_empty(&my_fifo_g), cesl_llfifo_full(&my_fifo_g));
    cesl_dprintf("llfifo_front()          : '%s'\n", cesl_llfifo_front(&my_fifo_g));

    cesl_llfifo_pop(&my_fifo_g);
    cesl_dprintf("llfifo_empty()          : '%d'  llfifo_full(): '%d'\n", cesl_llfifo_empty(&my_fifo_g), cesl_llfifo_full(&my_fifo_g));
    cesl_dprintf("llfifo_front()          : '%s'\n", cesl_llfifo_front(&my_fifo_g));

    cesl_llfifo_pop(&my_fifo_g);
    cesl_dprintf("llfifo_empty()          : '%d'  llfifo_full(): '%d'\n", cesl_llfifo_empty(&my_fifo_g), cesl_llfifo_full(&my_fifo_g));
    cesl_dprintf("llfifo_front()          : '%s'\n", cesl_llfifo_front(&my_fifo_g));

    cesl_dprintf("llfifo_push('fifth')   : '%d'\n", test_llfifo_push("fifth"));
    cesl_dprintf("llfifo_empty()          : '%d'  llfifo_full(): '%d'\n", cesl_llfifo_empty(&my_fifo_g), cesl_llfifo_full(&my_fifo_g));
    cesl_dprintf("llfifo_front()          : '%s'\n", cesl_llfifo_front(&my_fifo_g));

    return 0;
}